

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_schnorrsig.cpp
# Opt level: O2

SchnorrSignature *
cfd::core::SignCommon
          (SchnorrSignature *__return_storage_ptr__,ByteData256 *msg,Privkey *sk,
          secp256k1_nonce_function_hardened *nonce_fn,ByteData *ndata)

{
  SchnorrSignature *pSVar1;
  int iVar2;
  secp256k1_context_struct *ctx;
  CfdException *pCVar3;
  secp256k1_nonce_function_hardened p_Var4;
  secp256k1_schnorrsig_extraparams *this;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> raw_sig;
  secp256k1_schnorrsig_extraparams local_c8;
  SchnorrSignature *local_b0;
  uchar *local_a8 [3];
  secp256k1_keypair keypair;
  
  local_b0 = __return_storage_ptr__;
  ctx = wally_get_secp_context();
  Privkey::GetData((ByteData *)&raw_sig,sk);
  ByteData::GetBytes(&data,(ByteData *)&raw_sig);
  iVar2 = secp256k1_keypair_create
                    (ctx,&keypair,
                     data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&raw_sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  if (iVar2 != 1) {
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)&data,"Could not create keypair.",(allocator *)&raw_sig);
    CfdException::CfdException(pCVar3,kCfdInternalError,(string *)&data);
    __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  if (nonce_fn == (secp256k1_nonce_function_hardened *)0x0) {
    p_Var4 = (secp256k1_nonce_function_hardened)0x0;
  }
  else {
    p_Var4 = *nonce_fn;
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&raw_sig,0x40,
             (allocator_type *)&data);
  if (p_Var4 == (secp256k1_nonce_function_hardened)0x0) {
    ByteData256::GetBytes(&data,msg);
    ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_c8,ndata);
    iVar2 = secp256k1_schnorrsig_sign32
                      (ctx,raw_sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                       data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start,&keypair,
                       (uchar *)CONCAT44(local_c8._4_4_,local_c8.magic));
    this = &local_c8;
  }
  else {
    ByteData::GetBytes(&data,ndata);
    local_c8.magic[0] = 0xda;
    local_c8.magic[1] = 'o';
    local_c8.magic[2] = 0xb3;
    local_c8.magic[3] = 0x8c;
    local_c8.ndata =
         data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_c8.noncefp = p_Var4;
    ByteData256::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a8,msg);
    iVar2 = secp256k1_schnorrsig_sign_custom
                      (ctx,raw_sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                           ._M_impl.super__Vector_impl_data._M_start,local_a8[0],0x20,&keypair,
                       &local_c8);
    this = (secp256k1_schnorrsig_extraparams *)local_a8;
  }
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)this);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  if (iVar2 == 1) {
    ByteData::ByteData((ByteData *)&data,&raw_sig);
    pSVar1 = local_b0;
    SchnorrSignature::SchnorrSignature(local_b0,(ByteData *)&data);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&raw_sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    return pSVar1;
  }
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string
            ((string *)&data,"Could not create Schnorr signature.",(allocator *)&local_c8);
  CfdException::CfdException(pCVar3,kCfdInternalError,(string *)&data);
  __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

SchnorrSignature SignCommon(
    const ByteData256 &msg, const Privkey &sk,
    const secp256k1_nonce_function_hardened *nonce_fn, const ByteData ndata) {
  auto ctx = wally_get_secp_context();
  secp256k1_keypair keypair;
  auto ret =
      secp256k1_keypair_create(ctx, &keypair, sk.GetData().GetBytes().data());

  if (ret != 1) {
    throw CfdException(
        CfdError::kCfdInternalError, "Could not create keypair.");
  }

  secp256k1_nonce_function_hardened nfn =
      nonce_fn == nullptr ? nullptr : *nonce_fn;

  std::vector<uint8_t> raw_sig(SchnorrSignature::kSchnorrSignatureSize);

  if (nfn == nullptr) {
    ret = secp256k1_schnorrsig_sign32(
        ctx, raw_sig.data(), msg.GetBytes().data(), &keypair,
        ndata.GetBytes().data());
  } else {
    std::vector<uint8_t> data = ndata.GetBytes();
    secp256k1_schnorrsig_extraparams extra_params = {
        SECP256K1_SCHNORRSIG_EXTRAPARAMS_MAGIC,
        nfn,
        data.data(),
    };
    ret = secp256k1_schnorrsig_sign_custom(
        ctx, raw_sig.data(), msg.GetBytes().data(), kByteData256Length,
        &keypair, &extra_params);
  }

  if (ret != 1) {
    throw CfdException(
        CfdError::kCfdInternalError, "Could not create Schnorr signature.");
  }

  return SchnorrSignature(raw_sig);
}